

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O1

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  bool bVar1;
  int iVar2;
  double in_RAX;
  RapidJSONException *this;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double result;
  double local_28;
  
  local_28 = in_RAX;
  if (d < 0.0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: d >= 0.0");
  }
  else if (length == 0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length >= 1");
  }
  else {
    local_28 = 0.0;
    if (p - 0x17U < 0xf) {
      if (0x134 < p - 0x16U) {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: n >= 0 && n <= 308");
        goto LAB_0015dbb0;
      }
      d = d * *(double *)(Pow10(int)::e + (ulong)(p - 0x16U) * 8);
      p = 0x16;
    }
    if (d <= 9007199254740991.0 && p + 0x16U < 0x2d) {
      dVar9 = FastPath(d,p);
      return dVar9;
    }
    if (length >> 0x1f == 0) {
      if (length < decimalPosition) {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: length >= decimalPosition");
      }
      else if (length - decimalPosition < 0x80000000) {
        uVar3 = (uint)(length - decimalPosition);
        if (exp < (int)(uVar3 | 0x80000000)) {
          this = (RapidJSONException *)__cxa_allocate_exception(0x10);
          cereal::RapidJSONException::RapidJSONException
                    (this,"rapidjson internal assertion failure: exp >= INT_MIN + dExpAdjust");
        }
        else {
          iVar2 = exp - uVar3;
          uVar3 = (uint)length;
          if (iVar2 <= (int)(uVar3 ^ 0x7fffffff)) {
            uVar6 = 1;
            if ((int)uVar3 < 1) {
              uVar6 = uVar3;
            }
            uVar5 = length & 0xffffffff;
            do {
              if (*decimals != '0') goto LAB_0015da0e;
              iVar4 = (int)uVar5;
              decimals = decimals + 1;
              uVar5 = (ulong)(iVar4 - 1);
            } while (1 < iVar4);
            uVar5 = (ulong)(uVar6 - 1);
LAB_0015da0e:
            iVar4 = (int)uVar5;
            if (0 < iVar4) {
              iVar7 = exp + iVar4;
              do {
                if (decimals[uVar5 - 1] != '0') {
                  iVar4 = (int)uVar5;
                  goto LAB_0015da3a;
                }
                iVar2 = iVar2 + 1;
                bVar1 = 1 < (long)uVar5;
                uVar5 = uVar5 - 1;
              } while (bVar1);
              iVar4 = 0;
              iVar2 = ((int)decimalPosition + iVar7) - uVar3;
            }
LAB_0015da3a:
            if (iVar4 == 0) {
              return 0.0;
            }
            iVar7 = 0x300;
            if (iVar4 < 0x300) {
              iVar7 = iVar4;
            }
            iVar8 = 0;
            if (0x300 < iVar4) {
              iVar8 = iVar4 + -0x300;
            }
            iVar8 = iVar8 + iVar2;
            if (iVar8 + iVar7 < -0x143) {
              return 0.0;
            }
            if (0x135 < iVar8 + iVar7) {
              return INFINITY;
            }
            bVar1 = StrtodDiyFp(decimals,iVar7,iVar8,&local_28);
            if (bVar1) {
              return local_28;
            }
            dVar9 = StrtodBigInteger(local_28,decimals,iVar7,iVar8);
            return dVar9;
          }
          this = (RapidJSONException *)__cxa_allocate_exception(0x10);
          cereal::RapidJSONException::RapidJSONException
                    (this,"rapidjson internal assertion failure: dExp <= INT_MAX - dLen");
        }
      }
      else {
        this = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this,"rapidjson internal assertion failure: length - decimalPosition <= INT_MAX")
        ;
      }
    }
    else {
      this = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this,"rapidjson internal assertion failure: length <= INT_MAX");
    }
  }
LAB_0015dbb0:
  __cxa_throw(this,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    CEREAL_RAPIDJSON_ASSERT(d >= 0.0);
    CEREAL_RAPIDJSON_ASSERT(length >= 1);

    double result = 0.0;
    if (StrtodFast(d, p, &result))
        return result;

    CEREAL_RAPIDJSON_ASSERT(length <= INT_MAX);
    int dLen = static_cast<int>(length);

    CEREAL_RAPIDJSON_ASSERT(length >= decimalPosition);
    CEREAL_RAPIDJSON_ASSERT(length - decimalPosition <= INT_MAX);
    int dExpAdjust = static_cast<int>(length - decimalPosition);

    CEREAL_RAPIDJSON_ASSERT(exp >= INT_MIN + dExpAdjust);
    int dExp = exp - dExpAdjust;

    // Make sure length+dExp does not overflow
    CEREAL_RAPIDJSON_ASSERT(dExp <= INT_MAX - dLen);

    // Trim leading zeros
    while (dLen > 0 && *decimals == '0') {
        dLen--;
        decimals++;
    }

    // Trim trailing zeros
    while (dLen > 0 && decimals[dLen - 1] == '0') {
        dLen--;
        dExp++;
    }

    if (dLen == 0) { // Buffer only contains zeros.
        return 0.0;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 767 + 1;
    if (dLen > kMaxDecimalDigit) {
        dExp += dLen - kMaxDecimalDigit;
        dLen = kMaxDecimalDigit;
    }

    // If too small, underflow to zero.
    // Any x <= 10^-324 is interpreted as zero.
    if (dLen + dExp <= -324)
        return 0.0;

    // If too large, overflow to infinity.
    // Any x >= 10^309 is interpreted as +infinity.
    if (dLen + dExp > 309)
        return std::numeric_limits<double>::infinity();

    if (StrtodDiyFp(decimals, dLen, dExp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, dLen, dExp);
}